

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O1

string * GenerateId_abi_cxx11_(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  time_t tVar9;
  string *in_RDI;
  char str_uuid [80];
  
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  uVar1 = rand();
  uVar2 = rand();
  uVar3 = rand();
  uVar4 = rand();
  iVar5 = rand();
  uVar6 = rand();
  uVar7 = rand();
  uVar8 = rand();
  snprintf(str_uuid,0x50,"%x%x-%x-%x-%x-%x%x%x",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
           (ulong)(uVar4 & 0xfff | 0x4000),(ulong)(iVar5 % 0x3fff + 0x8000),(ulong)uVar6,
           (ulong)uVar7,(ulong)uVar8);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(str_uuid);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string GenerateId() {
    char str_uuid[80];
    srand(time(NULL));
    snprintf(str_uuid, sizeof(str_uuid),
             "%x%x-%x-%x-%x-%x%x%x",
             rand(),
             rand(),
             rand(),
             ((rand() & 0x0fff) | 0x4000),
             rand() % 0x3fff + 0x8000,
             rand(),
             rand(),
             rand());
    return str_uuid;
}